

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_store_string(char **dest,char *src)

{
  size_t __n;
  char *__dest;
  
  __n = strlen(src);
  if (__n < 0xffff) {
    free(*dest);
    __dest = mcpl_internal_malloc(__n + 1);
    *dest = __dest;
    memcpy(__dest,src,__n);
    __dest[__n] = '\0';
    return;
  }
  mcpl_error("string length out of range");
}

Assistant:

MCPL_LOCAL void mcpl_store_string(char** dest, const char * src)
{
  size_t n = strlen(src);
  if (n>65534) {
    n = 65534;
    mcpl_error("string length out of range");
  }
  if (*dest)
    free(*dest);
  *dest = mcpl_internal_malloc(n+1);

  //Usage of strncpy cause compiler warning on newer gcc, so we use memcpy
  //instead (should be safe, we just checked strlen above!):
  //strncpy( *dest,src,n );
  memcpy( *dest,src,n );
  (*dest)[n] = '\0';
  return;
}